

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

void __thiscall Instance::print(Instance *this)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int i;
  
  puts("Instance:");
  if (0 < this->m) {
    lVar2 = 0;
    uVar4 = 0;
    do {
      uVar5 = uVar4 + 1;
      printf("i=%d (nopts: %d, demand: %d)\n",uVar5 & 0xffffffff,
             (ulong)(uint)(this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar4],
             (ulong)(uint)(this->demands).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar4]);
      if (0 < (this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4]) {
        lVar2 = (long)(int)lVar2;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + 1;
          printf("  opt=%d: (");
          if (0 < this->ndims) {
            i = 0;
            do {
              if (i != 0) {
                printf(", ");
              }
              uVar1 = Item::operator[]((this->items).super__Vector_base<Item,_std::allocator<Item>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar2,i);
              printf("%d",(ulong)uVar1);
              i = i + 1;
            } while (i < this->ndims);
          }
          puts(")");
          lVar2 = lVar2 + 1;
        } while (iVar3 < (this->nopts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar4]);
      }
      uVar4 = uVar5;
    } while ((long)uVar5 < (long)this->m);
  }
  return;
}

Assistant:

void Instance::print() const {
	printf("Instance:\n");
	int p = 0;
	for (int i = 0; i < m; i++) {
		printf("i=%d (nopts: %d, demand: %d)\n", i + 1, nopts[i], demands[i]);
		for (int q = 0; q < nopts[i]; q++) {
			printf("  opt=%d: (", q + 1);
			for (int j = 0; j < ndims; j++) {
				if (j) {
					printf(", ");
				}
				printf("%d", items[p][j]);
			}
			printf(")\n");
			p++;
		}
	}
}